

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-101.cpp
# Opt level: O3

bool __thiscall
baryonyx::itm::
solver_equalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>
::
compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (solver_equalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>
           *this,bit_array *x,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last,longdouble kappa,
          longdouble delta,longdouble theta)

{
  rc_data *__last;
  int k;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  bool bVar1;
  rc_size rVar2;
  undefined8 extraout_RAX;
  bool bVar3;
  _Head_base<0UL,_int_*,_false> _Var4;
  rc_data *__first;
  int iVar5;
  rc_data *__last_00;
  int iVar6;
  long lVar7;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_58;
  _Head_base<0UL,_int_*,_false> local_50;
  longdouble local_48;
  longdouble local_3c;
  
  local_3c = delta;
  local_48 = kappa;
  if (first._M_current == last._M_current) {
    bVar3 = false;
  }
  else {
    bVar3 = false;
    do {
      k = *first._M_current;
      if (*(int *)(this + 0x80) <= k) {
        compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  ();
        __clang_call_terminate(extraout_RAX);
      }
      sparse_matrix<int>::row((sparse_matrix<int> *)&local_58,(int)this + 0x10);
      if ((tuple<int_*,_std::default_delete<int[]>_>)local_50._M_head_impl !=
          (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
          local_58._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl) {
        lVar7 = *(long *)(this + 0x50);
        _Var4._M_head_impl = local_50._M_head_impl;
        do {
          iVar6 = *_Var4._M_head_impl;
          _Var4._M_head_impl = _Var4._M_head_impl + 8;
          *(longdouble *)(lVar7 + (long)iVar6 * 0x10) =
               *(longdouble *)(lVar7 + (long)iVar6 * 0x10) * theta;
        } while ((tuple<int_*,_std::default_delete<int[]>_>)_Var4._M_head_impl !=
                 (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
                 local_58._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl);
      }
      rVar2 = solver_equalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
              ::compute_reduced_costs<baryonyx::bit_array>
                        ((solver_equalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
                          *)this,(row_iterator)local_50._M_head_impl,
                         (row_iterator)
                         local_58._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                         super__Head_base<0UL,_int_*,_false>._M_head_impl,x);
      iVar6 = rVar2.r_size;
      lVar7 = (long)iVar6;
      if (1 < lVar7) {
        __first = *(rc_data **)(this + 0x60);
        __g = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)(this + 8);
        __last = __first + lVar7;
        std::
        __introsort_loop<baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*>(baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*,baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,__last,(int)LZCOUNT(lVar7) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*>(baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*,baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,__last);
        lVar7 = lVar7 * 0x20 + -0x20;
        __last_00 = __first;
        do {
          __last_00 = __last_00 + 1;
          if ((__first->value != __last_00->value) || (NAN(__first->value) || NAN(__last_00->value))
             ) {
            std::
            shuffle<baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                      (__first,__last_00,__g);
            __first = __last_00;
          }
          lVar7 = lVar7 + -0x20;
        } while (lVar7 != 0);
        std::
        shuffle<baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  (__first,__last,__g);
      }
      iVar5 = rVar2.c_size + *(int *)(*(long *)(this + 0x68) + (long)k * 8);
      if (iVar6 < iVar5) {
        iVar5 = iVar6;
      }
      bVar1 = affect<baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,long_double>
                        ((solver_equalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
                          *)this,x,(row_value *)local_50._M_head_impl,k,iVar5 + -1,iVar6,local_48,
                         local_3c);
      first._M_current = first._M_current + 1;
      bVar3 = (bool)(bVar3 | bVar1);
    } while (first._M_current != last._M_current);
  }
  return bVar3;
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            bx_expects(k < m);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto sizes =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            calculator_sort<Mode>(R.get(), R.get() + sizes.r_size, rng);
            int selected = select_variables(sizes, b[k].value);

            logger::log("constraints {}: {} = ", k, b[k].value);

            for (int i = 0; i < sizes.r_size; ++i)
                logger::log("{} ({}) ", R[i].value, R[i].id);

            logger::log(" => Selected: {}\n", selected);

            auto pi_change = affect(*this,
                                    x,
                                    std::get<0>(it),
                                    k,
                                    selected,
                                    sizes.r_size,
                                    kappa,
                                    delta);
            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }